

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O2

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_long,_float>::KeyValue,_unsigned_long>::sort
          (ParallelRadixSort<embree::parallel_map<unsigned_long,_float>::KeyValue,_unsigned_long>
           *this,size_t blockSize)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  size_t numTasks;
  
  uVar3 = this->N;
  if (blockSize < uVar3) {
    uVar2 = ((blockSize + uVar3) - 1) / blockSize;
    iVar1 = tbb::detail::d1::max_concurrency();
    uVar3 = (long)iVar1;
    if (uVar2 < (ulong)(long)iVar1) {
      uVar3 = uVar2;
    }
    numTasks = 0x40;
    if (uVar3 < 0x40) {
      numTasks = uVar3;
    }
    tbbRadixSort(this,numTasks);
    return;
  }
  std::
  __sort<embree::parallel_map<unsigned_long,float>::KeyValue*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(embree::parallel_map<unsigned_long,float>::KeyValue_const&,embree::parallel_map<unsigned_long,float>::KeyValue_const&)>>
            (this->src,this->src + uVar3,
             (_Iter_comp_iter<bool_(*)(const_embree::parallel_map<unsigned_long,_float>::KeyValue_&,_const_embree::parallel_map<unsigned_long,_float>::KeyValue_&)>
              )0x5b8bca);
  return;
}

Assistant:

void sort(const size_t blockSize)
    {
      assert(blockSize > 0);
      
      /* perform single threaded sort for small N */
      if (N<=blockSize) // handles also special case of 0!
      {	  
        /* do inplace sort inside destination array */
        std::sort(src,src+N,compare<Ty>);
      }
      
      /* perform parallel sort for large N */
      else 
      {
        const size_t numThreads = min((N+blockSize-1)/blockSize,TaskScheduler::threadCount(),size_t(MAX_TASKS));
        tbbRadixSort(numThreads);
      }
    }